

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.h
# Opt level: O2

void __thiscall
hiberlite::ExtractModel::putNamedColumn
          (ExtractModel *this,string *table,string *colname,string *storClass)

{
  bool bVar1;
  mapped_type *pmVar2;
  logic_error *this_00;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  Column local_70;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                         *)this,table);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                         *)this,table);
  std::__cxx11::string::string((string *)&local_90,(string *)colname);
  bVar1 = Table::contains(pmVar2,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (!bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                           *)this,table);
    std::__cxx11::string::string((string *)&local_d0,(string *)colname);
    std::__cxx11::string::string((string *)&local_f0,(string *)storClass);
    Column::Column(&local_70,&local_d0,&local_f0);
    Table::add(pmVar2,&local_70);
    Column::~Column(&local_70);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b0,colname,": column name is in use");
  std::logic_error::logic_error(this_00,(string *)&local_b0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline void putNamedColumn(std::string table, std::string colname, std::string storClass){
			model[ table ].name=table;
			if( model[table].contains( colname ) )
				throw std::logic_error(colname+": column name is in use");
			model[ table ].add( Column(colname,storClass) );
		}